

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setType(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Type tp)

{
  Verbosity VVar1;
  Verbosity in_ESI;
  SPxOut *in_RDI;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  Verbosity local_10 [4];
  
  if (in_RDI[0x30].m_verbosity != in_ESI) {
    in_RDI[0x30].m_verbosity = in_ESI;
    forceRecompNonbasicValue
              ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    (*in_RDI->_vptr_SPxOut[0x77])();
    if ((in_RDI[0xaa].m_streams != (ostream **)0x0) &&
       (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[0xaa].m_streams), 4 < (int)VVar1)) {
      local_10[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[0xaa].m_streams);
      (**(code **)(*in_RDI[0xaa].m_streams + 0x10))(in_RDI[0xaa].m_streams,&stack0xffffffffffffffec)
      ;
      soplex::operator<<(in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<(in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<(in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<(in_RDI,in_stack_ffffffffffffffd8);
      (**(code **)(*in_RDI[0xaa].m_streams + 0x10))(in_RDI[0xaa].m_streams,local_10);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setType(Type tp)
{

   if(theType != tp)
   {
      theType = tp;

      forceRecompNonbasicValue();

      unInit();
#if 0
      else
      {
         if(!matrixIsSetup)
         {
            SPxBasisBase<R>::load(this);
            // SPxBasisBase<R>::load(desc());
            // not needed, because load(this) allready loads descriptor
         }

         factorized = false;
         m_numCycle = 0;
#endif
         SPX_MSG_INFO3((*spxout), (*spxout) << "Switching to "
                       << static_cast<const char*>((tp == LEAVE)
                             ? "leaving" : "entering")
                       << " algorithm" << std::endl;)
      }
   }